

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O0

void __thiscall
DiscreteSpaceInformation::EnsureHeuristicsUpdated
          (DiscreteSpaceInformation *this,bool bGoalHeuristics)

{
  bool bGoalHeuristics_local;
  DiscreteSpaceInformation *this_local;
  
  return;
}

Assistant:

virtual void EnsureHeuristicsUpdated(bool bGoalHeuristics)
    {
        // by default the heuristics are up-to-date, but in some cases, the
        // heuristics are computed only when really needed. For example,
        // xytheta environment uses 2D gridsearch as heuristics, and then
        // re-computes them only when this function is called. This minimizes
        // the number of times heuristics are re-computed which is an expensive
        // operation if bGoalHeuristics == true, then it updates goal
        // heuristics (for forward search), otherwise it updates start
        // heuristics (for backward search)
    }